

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O1

aiMesh * __thiscall
Assimp::MMDImporter::CreateMesh(MMDImporter *this,PmxModel *pModel,int indexStart,int indexCount)

{
  PmxBone *pPVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  PmxVertex *pPVar5;
  aiVector3D *paVar6;
  _Head_base<0UL,_pmx::PmxVertexSkinning_*,_false> _Var7;
  PmxBone *pPVar8;
  _Base_ptr p_Var9;
  aiBone **ppaVar10;
  long lVar11;
  aiMesh *paVar12;
  ulong *puVar13;
  aiFace *paVar14;
  ulong uVar15;
  int *piVar16;
  aiVector3D *paVar17;
  mapped_type *pmVar18;
  aiBone *paVar19;
  _Base_ptr p_Var20;
  aiVertexWeight *__s;
  aiFace *paVar21;
  float *pfVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  _Rb_tree_header *p_Var26;
  uint uVar27;
  ulong uVar28;
  PmxModel *pPVar29;
  _Rb_tree_header *p_Var30;
  ulong uVar31;
  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  bone_vertex_map;
  aiVertexWeight local_a0;
  aiBone **local_98;
  long local_90;
  PmxModel *local_88;
  _Rb_tree<int,_std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  local_80;
  ulong local_50;
  long local_48;
  aiMesh *local_40;
  long local_38;
  
  local_90 = CONCAT44(local_90._4_4_,indexStart);
  local_88 = pModel;
  paVar12 = (aiMesh *)operator_new(0x520);
  paVar12->mPrimitiveTypes = 0;
  paVar12->mNumVertices = 0;
  paVar12->mNumFaces = 0;
  memset(&paVar12->mVertices,0,0xcc);
  paVar12->mBones = (aiBone **)0x0;
  paVar12->mMaterialIndex = 0;
  (paVar12->mName).length = 0;
  (paVar12->mName).data[0] = '\0';
  memset((paVar12->mName).data + 1,0x1b,0x3ff);
  paVar12->mNumAnimMeshes = 0;
  paVar12->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar12->mMethod = 0;
  (paVar12->mAABB).mMin.x = 0.0;
  (paVar12->mAABB).mMin.y = 0.0;
  (paVar12->mAABB).mMin.z = 0.0;
  (paVar12->mAABB).mMax.x = 0.0;
  (paVar12->mAABB).mMax.y = 0.0;
  (paVar12->mAABB).mMax.z = 0.0;
  paVar12->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar12->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar12->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar12->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar12->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar12->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar12->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar12->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar12->mNumUVComponents[0] = 0;
  paVar12->mNumUVComponents[1] = 0;
  paVar12->mNumUVComponents[2] = 0;
  paVar12->mNumUVComponents[3] = 0;
  paVar12->mNumUVComponents[4] = 0;
  paVar12->mNumUVComponents[5] = 0;
  paVar12->mNumUVComponents[6] = 0;
  paVar12->mNumUVComponents[7] = 0;
  paVar12->mColors[0] = (aiColor4D *)0x0;
  paVar12->mColors[1] = (aiColor4D *)0x0;
  paVar12->mColors[2] = (aiColor4D *)0x0;
  paVar12->mColors[3] = (aiColor4D *)0x0;
  paVar12->mColors[4] = (aiColor4D *)0x0;
  paVar12->mColors[5] = (aiColor4D *)0x0;
  paVar12->mColors[6] = (aiColor4D *)0x0;
  paVar12->mColors[7] = (aiColor4D *)0x0;
  paVar12->mNumVertices = indexCount;
  local_98 = (aiBone **)CONCAT44(local_98._4_4_,indexCount);
  uVar27 = indexCount / 3;
  uVar15 = (ulong)uVar27;
  paVar12->mNumFaces = uVar27;
  puVar13 = (ulong *)operator_new__(uVar15 * 0x10 + 8);
  *puVar13 = uVar15;
  paVar14 = (aiFace *)(puVar13 + 1);
  if (4 < indexCount + 2U) {
    paVar21 = paVar14;
    do {
      paVar21->mNumIndices = 0;
      paVar21->mIndices = (uint *)0x0;
      paVar21 = paVar21 + 1;
    } while (paVar21 != paVar14 + uVar15);
  }
  paVar12->mFaces = paVar14;
  if (4 < indexCount + 2U) {
    uVar15 = 1;
    if (1 < uVar27) {
      uVar15 = (ulong)uVar27;
    }
    lVar25 = 0;
    do {
      *(undefined4 *)(puVar13 + 1) = 3;
      piVar16 = (int *)operator_new__(0xc);
      iVar24 = (int)lVar25;
      *piVar16 = iVar24;
      piVar16[1] = iVar24 + 1;
      piVar16[2] = iVar24 + 2;
      puVar13[2] = (ulong)piVar16;
      lVar25 = lVar25 + 3;
      puVar13 = puVar13 + 2;
    } while (uVar15 * 3 != lVar25);
  }
  iVar24 = (int)local_98;
  uVar23 = (ulong)local_98 & 0xffffffff;
  uVar15 = uVar23 * 0xc;
  paVar17 = (aiVector3D *)operator_new__(uVar15);
  if (iVar24 != 0) {
    memset(paVar17,0,((uVar23 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar12->mVertices = paVar17;
  paVar17 = (aiVector3D *)operator_new__(uVar15);
  pPVar29 = local_88;
  if ((int)local_98 != 0) {
    memset(paVar17,0,((uVar23 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar12->mNormals = paVar17;
  paVar17 = (aiVector3D *)operator_new__(uVar15);
  if ((int)local_98 != 0) {
    memset(paVar17,0,((uVar23 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar12->mTextureCoords[0] = paVar17;
  paVar12->mNumUVComponents[0] = 2;
  uVar28 = (ulong)(pPVar29->setting).uv;
  local_50 = uVar23;
  if (uVar28 != 0) {
    uVar31 = 0;
    do {
      paVar17 = (aiVector3D *)operator_new__(uVar15);
      if ((int)local_98 != 0) {
        memset(paVar17,0,((uVar23 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar12->mTextureCoords[uVar31 + 1] = paVar17;
      paVar12->mNumUVComponents[uVar31 + 1] = 4;
      uVar31 = uVar31 + 1;
    } while (uVar28 != uVar31);
  }
  pPVar29 = local_88;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)local_98) {
    local_38 = (long)(int)local_90;
    uVar15 = 0;
    do {
      iVar24 = (pPVar29->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar15 + local_38];
      pPVar5 = (pPVar29->vertices)._M_t.
               super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
               super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl;
      paVar6 = paVar12->mVertices;
      fVar3 = pPVar5[iVar24].position[1];
      fVar2 = pPVar5[iVar24].position[2];
      paVar17 = paVar6 + uVar15;
      paVar17->x = pPVar5[iVar24].position[0];
      paVar17->y = fVar3;
      paVar6[uVar15].z = fVar2;
      paVar6 = paVar12->mNormals;
      fVar3 = pPVar5[iVar24].normal[1];
      fVar2 = pPVar5[iVar24].normal[2];
      paVar17 = paVar6 + uVar15;
      paVar17->x = pPVar5[iVar24].normal[0];
      paVar17->y = fVar3;
      paVar6[uVar15].z = fVar2;
      paVar17 = paVar12->mTextureCoords[0];
      paVar17[uVar15].x = pPVar5[iVar24].uv[0];
      paVar17[uVar15].y = pPVar5[iVar24].uv[1];
      if ((pPVar29->setting).uv != '\0') {
        pfVar22 = (float *)((long)(pPVar5[iVar24].uva + 1) + 4);
        uVar23 = 0;
        do {
          paVar17 = paVar12->mTextureCoords[uVar23 + 1];
          paVar17[uVar15].x = (*(float (*) [4])(pfVar22 + -1))[0];
          paVar17[uVar15].y = *pfVar22;
          uVar23 = uVar23 + 1;
          pfVar22 = pfVar22 + 4;
        } while (uVar23 < (pPVar29->setting).uv);
      }
      _Var7._M_head_impl =
           *(PmxVertexSkinning **)
            &pPVar5[iVar24].skinning._M_t.
             super___uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
      ;
      if ((tuple<pmx::PmxVertexSkinning_*,_std::default_delete<pmx::PmxVertexSkinning>_>)
          _Var7._M_head_impl == (_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)0x0) {
        local_48 = 0;
        local_90 = 0;
        local_98 = (aiBone **)0x0;
        lVar25 = 0;
      }
      else {
        local_48 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF1::typeinfo,0);
        local_90 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF2::typeinfo,0);
        local_98 = (aiBone **)
                   __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF4::typeinfo,0);
        lVar25 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                &pmx::PmxVertexSkinningSDEF::typeinfo,0);
      }
      lVar11 = local_90;
      ppaVar10 = local_98;
      uVar27 = (uint)uVar15;
      switch(pPVar5[iVar24].skinning_type) {
      case BDEF1:
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)(local_48 + 8));
        local_a0.mWeight = 1.0;
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        break;
      case BDEF2:
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)(local_90 + 8));
        local_a0.mWeight = *(float *)(lVar11 + 0x10);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)(lVar11 + 0xc));
        local_a0.mWeight = 1.0 - *(float *)(lVar11 + 0x10);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        break;
      case BDEF4:
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)((long)local_98 + 8));
        local_a0.mWeight = *(float *)((long)ppaVar10 + 0x18);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)((long)ppaVar10 + 0xc));
        local_a0.mWeight = *(float *)((long)ppaVar10 + 0x1c);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)((long)ppaVar10 + 0x10));
        local_a0.mWeight = *(float *)((long)ppaVar10 + 0x20);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)((long)ppaVar10 + 0x14));
        local_a0.mWeight = *(float *)((long)ppaVar10 + 0x24);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        break;
      case SDEF:
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)(lVar25 + 8));
        local_a0.mWeight = *(float *)(lVar25 + 0x10);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)(lVar25 + 0xc));
        local_a0.mWeight = 1.0 - *(float *)(lVar25 + 0x10);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        break;
      case QDEF:
        if ((_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)_Var7._M_head_impl ==
            (_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)0x0) {
          lVar25 = 0;
        }
        else {
          lVar25 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningQDEF::typeinfo,0);
        }
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)(lVar25 + 8));
        local_a0.mWeight = *(float *)(lVar25 + 0x18);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)(lVar25 + 0xc));
        local_a0.mWeight = *(float *)(lVar25 + 0x1c);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)(lVar25 + 0x10));
        local_a0.mWeight = *(float *)(lVar25 + 0x20);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
        pmVar18 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_80,(key_type_conflict2 *)(lVar25 + 0x14));
        local_a0.mWeight = *(float *)(lVar25 + 0x24);
        local_a0.mVertexId = uVar27;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                  (pmVar18,&local_a0);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_50);
  }
  uVar27 = pPVar29->bone_count;
  uVar15 = 0xffffffffffffffff;
  if (-1 < (long)(int)uVar27) {
    uVar15 = (long)(int)uVar27 * 8;
  }
  local_98 = (aiBone **)operator_new__(uVar15);
  paVar12->mNumBones = uVar27;
  paVar12->mBones = local_98;
  if (0 < pPVar29->bone_count) {
    lVar25 = 0;
    local_40 = paVar12;
    do {
      p_Var26 = &local_80._M_impl.super__Rb_tree_header;
      paVar19 = (aiBone *)operator_new(0x450);
      (paVar19->mName).length = 0;
      (paVar19->mName).data[0] = '\0';
      memset((paVar19->mName).data + 1,0x1b,0x3ff);
      paVar19->mNumWeights = 0;
      paVar19->mWeights = (aiVertexWeight *)0x0;
      (paVar19->mOffsetMatrix).a1 = 1.0;
      (paVar19->mOffsetMatrix).a2 = 0.0;
      (paVar19->mOffsetMatrix).a3 = 0.0;
      (paVar19->mOffsetMatrix).a4 = 0.0;
      (paVar19->mOffsetMatrix).b1 = 0.0;
      (paVar19->mOffsetMatrix).b2 = 1.0;
      (paVar19->mOffsetMatrix).b3 = 0.0;
      (paVar19->mOffsetMatrix).b4 = 0.0;
      (paVar19->mOffsetMatrix).c1 = 0.0;
      (paVar19->mOffsetMatrix).c2 = 0.0;
      (paVar19->mOffsetMatrix).c3 = 1.0;
      (paVar19->mOffsetMatrix).c4 = 0.0;
      (paVar19->mOffsetMatrix).d1 = 0.0;
      (paVar19->mOffsetMatrix).d2 = 0.0;
      (paVar19->mOffsetMatrix).d3 = 0.0;
      (paVar19->mOffsetMatrix).d4 = 1.0;
      pPVar8 = (pPVar29->bones)._M_t.
               super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
               super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
      pPVar1 = pPVar8 + lVar25;
      uVar15 = pPVar8[lVar25].bone_name._M_string_length;
      if (uVar15 < 0x400) {
        (paVar19->mName).length = (ai_uint32)uVar15;
        memcpy((paVar19->mName).data,(pPVar1->bone_name)._M_dataplus._M_p,uVar15);
        (paVar19->mName).data[uVar15] = '\0';
      }
      fVar2 = pPVar1->position[0];
      fVar3 = pPVar1->position[1];
      fVar4 = pPVar1->position[2];
      (paVar19->mOffsetMatrix).a1 = 1.0;
      (paVar19->mOffsetMatrix).a2 = 0.0;
      (paVar19->mOffsetMatrix).a3 = 0.0;
      (paVar19->mOffsetMatrix).a4 = 0.0;
      (paVar19->mOffsetMatrix).b1 = 0.0;
      (paVar19->mOffsetMatrix).b2 = 1.0;
      (paVar19->mOffsetMatrix).b3 = 0.0;
      (paVar19->mOffsetMatrix).b4 = 0.0;
      (paVar19->mOffsetMatrix).c1 = 0.0;
      (paVar19->mOffsetMatrix).c2 = 0.0;
      (paVar19->mOffsetMatrix).c3 = 1.0;
      (paVar19->mOffsetMatrix).c4 = 0.0;
      (paVar19->mOffsetMatrix).d1 = 0.0;
      (paVar19->mOffsetMatrix).d2 = 0.0;
      (paVar19->mOffsetMatrix).d3 = 0.0;
      (paVar19->mOffsetMatrix).d4 = 1.0;
      (paVar19->mOffsetMatrix).a4 = -fVar2;
      (paVar19->mOffsetMatrix).b4 = -fVar3;
      (paVar19->mOffsetMatrix).c4 = -fVar4;
      p_Var20 = &p_Var26->_M_header;
      for (p_Var9 = local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
          p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < lVar25]) {
        if (lVar25 <= (int)*(size_t *)(p_Var9 + 1)) {
          p_Var20 = p_Var9;
        }
      }
      p_Var30 = p_Var26;
      if (((_Rb_tree_header *)p_Var20 != p_Var26) &&
         (p_Var30 = (_Rb_tree_header *)p_Var20,
         lVar25 < (int)((_Rb_tree_header *)p_Var20)->_M_node_count)) {
        p_Var30 = p_Var26;
      }
      if (p_Var30 != p_Var26) {
        uVar23 = *(long *)((long)(p_Var30 + 1) + 8) - *(long *)(p_Var30 + 1) >> 3;
        paVar19->mNumWeights = (uint)uVar23;
        uVar23 = uVar23 & 0xffffffff;
        uVar15 = uVar23 * 8;
        __s = (aiVertexWeight *)operator_new__(uVar15);
        if (uVar23 != 0) {
          memset(__s,0,uVar15);
        }
        paVar19->mWeights = __s;
        paVar12 = local_40;
        if (paVar19->mNumWeights != 0) {
          uVar15 = 0;
          do {
            paVar19->mWeights[uVar15] = *(aiVertexWeight *)(*(long *)(p_Var30 + 1) + uVar15 * 8);
            uVar15 = uVar15 + 1;
          } while (uVar15 < paVar19->mNumWeights);
        }
      }
      local_98[lVar25] = paVar19;
      lVar25 = lVar25 + 1;
      pPVar29 = local_88;
    } while (lVar25 < local_88->bone_count);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  ::~_Rb_tree(&local_80);
  return paVar12;
}

Assistant:

aiMesh *MMDImporter::CreateMesh(const pmx::PmxModel *pModel,
                                const int indexStart, const int indexCount) {
  aiMesh *pMesh = new aiMesh;

  pMesh->mNumVertices = indexCount;

  pMesh->mNumFaces = indexCount / 3;
  pMesh->mFaces = new aiFace[pMesh->mNumFaces];

  const int numIndices = 3; // triangular face
  for (unsigned int index = 0; index < pMesh->mNumFaces; index++) {
    pMesh->mFaces[index].mNumIndices = numIndices;
    unsigned int *indices = new unsigned int[numIndices];
    indices[0] = numIndices * index;
    indices[1] = numIndices * index + 1;
    indices[2] = numIndices * index + 2;
    pMesh->mFaces[index].mIndices = indices;
  }

  pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
  pMesh->mTextureCoords[0] = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNumUVComponents[0] = 2;

  // additional UVs
  for (int i = 1; i <= pModel->setting.uv; i++) {
    pMesh->mTextureCoords[i] = new aiVector3D[pMesh->mNumVertices];
    pMesh->mNumUVComponents[i] = 4;
  }

  map<int, vector<aiVertexWeight>> bone_vertex_map;

  // fill in contents and create bones
  for (int index = 0; index < indexCount; index++) {
    const pmx::PmxVertex *v =
        &pModel->vertices[pModel->indices[indexStart + index]];
    const float *position = v->position;
    pMesh->mVertices[index].Set(position[0], position[1], position[2]);
    const float *normal = v->normal;

    pMesh->mNormals[index].Set(normal[0], normal[1], normal[2]);
    pMesh->mTextureCoords[0][index].x = v->uv[0];
    pMesh->mTextureCoords[0][index].y = v->uv[1];

    for (int i = 1; i <= pModel->setting.uv; i++) {
      // TODO: wrong here? use quaternion transform?
      pMesh->mTextureCoords[i][index].x = v->uva[i][0];
      pMesh->mTextureCoords[i][index].y = v->uva[i][1];
    }

    // handle bone map
    const auto vsBDEF1_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF1 *>(v->skinning.get());
    const auto vsBDEF2_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF2 *>(v->skinning.get());
    const auto vsBDEF4_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF4 *>(v->skinning.get());
    const auto vsSDEF_ptr =
        dynamic_cast<pmx::PmxVertexSkinningSDEF *>(v->skinning.get());
    switch (v->skinning_type) {
    case pmx::PmxVertexSkinningType::BDEF1:
      bone_vertex_map[vsBDEF1_ptr->bone_index].push_back(
          aiVertexWeight(index, 1.0));
      break;
    case pmx::PmxVertexSkinningType::BDEF2:
      bone_vertex_map[vsBDEF2_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF2_ptr->bone_weight));
      bone_vertex_map[vsBDEF2_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsBDEF2_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::BDEF4:
      bone_vertex_map[vsBDEF4_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight1));
      bone_vertex_map[vsBDEF4_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight2));
      bone_vertex_map[vsBDEF4_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight3));
      bone_vertex_map[vsBDEF4_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight4));
      break;
    case pmx::PmxVertexSkinningType::SDEF: // TODO: how to use sdef_c, sdef_r0,
                                           // sdef_r1?
      bone_vertex_map[vsSDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsSDEF_ptr->bone_weight));
      bone_vertex_map[vsSDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsSDEF_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::QDEF:
      const auto vsQDEF_ptr =
          dynamic_cast<pmx::PmxVertexSkinningQDEF *>(v->skinning.get());
      bone_vertex_map[vsQDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight1));
      bone_vertex_map[vsQDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight2));
      bone_vertex_map[vsQDEF_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight3));
      bone_vertex_map[vsQDEF_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight4));
      break;
    }
  }

  // make all bones for each mesh
  // assign bone weights to skinned bones (otherwise just initialize)
  auto bone_ptr_ptr = new aiBone *[pModel->bone_count];
  pMesh->mNumBones = pModel->bone_count;
  pMesh->mBones = bone_ptr_ptr;
  for (auto ii = 0; ii < pModel->bone_count; ++ii) {
    auto pBone = new aiBone;
    const auto &pmxBone = pModel->bones[ii];
    pBone->mName = pmxBone.bone_name;
    aiVector3D pos(pmxBone.position[0], pmxBone.position[1], pmxBone.position[2]);
    aiMatrix4x4::Translation(-pos, pBone->mOffsetMatrix);
    auto it = bone_vertex_map.find(ii);
    if (it != bone_vertex_map.end()) {
      pBone->mNumWeights = static_cast<unsigned int>(it->second.size());
      pBone->mWeights = new aiVertexWeight[pBone->mNumWeights];
      for (unsigned int j = 0; j < pBone->mNumWeights; j++) {
          pBone->mWeights[j] = it->second[j];
      }
    }
    bone_ptr_ptr[ii] = pBone;
  }

  return pMesh;
}